

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O2

class_spell_conflict * spell_by_index(player *p,wchar_t index)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  class_spell *pcVar3;
  wchar_t *pwVar4;
  int iVar5;
  
  if (L'\xffffffff' < index) {
    pcVar3 = (class_spell *)0x0;
    if (index < (p->class->magic).total_spells) {
      pwVar1 = &((p->class->magic).books)->num_spells;
      do {
        pwVar4 = pwVar1;
        iVar5 = (int)pcVar3;
        wVar2 = *pwVar4 + iVar5;
        pcVar3 = (class_spell *)(ulong)(uint)wVar2;
        pwVar1 = pwVar4 + 8;
      } while (wVar2 <= index);
      pcVar3 = *(class_spell **)(pwVar4 + 3) + (index - iVar5);
    }
    return (class_spell_conflict *)pcVar3;
  }
  return (class_spell_conflict *)0x0;
}

Assistant:

const struct class_spell *spell_by_index(const struct player *p, int index)
{
	int book = 0, count = 0;
	const struct class_magic *magic = &p->class->magic;

	/* Check index validity */
	if (index < 0 || index >= magic->total_spells)
		return NULL;

	/* Find the book, count the spells in previous books */
	while (count + magic->books[book].num_spells - 1 < index)
		count += magic->books[book++].num_spells;

	/* Find the spell */
	return &magic->books[book].spells[index - count];
}